

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O1

int Spl_ManFindOne(Spl_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Vec_Wec_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  
  pVVar11 = p->vNodes;
  uVar13 = (ulong)(uint)pVVar11->nSize;
  if (0 < pVVar11->nSize) {
    pGVar3 = p->pGia;
    pVVar4 = pGVar3->vMapping2;
    piVar5 = pVVar11->pArray;
    lVar12 = 0;
    do {
      lVar14 = (long)piVar5[lVar12];
      if ((lVar14 < 0) || (pVVar4->nSize <= piVar5[lVar12])) goto LAB_007d37cb;
      pVVar6 = pVVar4->pArray;
      if (pVVar6 == (Vec_Int_t *)0x0) break;
      if (0 < pVVar6[lVar14].nSize) {
        piVar7 = pGVar3->pLutRefs;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x25d,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
        }
        piVar8 = pVVar6[lVar14].pArray;
        lVar15 = 0;
        do {
          piVar1 = piVar7 + piVar8[lVar15];
          *piVar1 = *piVar1 + -1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar6[lVar14].nSize);
      }
      lVar12 = lVar12 + 1;
      uVar13 = (ulong)pVVar11->nSize;
    } while (lVar12 < (long)uVar13);
  }
  if ((((uVar13 & 1) != 0) && (p->fReverse != 0)) && (pVVar11 = p->vNodes, 0 < pVVar11->nSize)) {
    lVar12 = 0;
    do {
      piVar5 = p->pGia->pLutRefs;
      if (piVar5 == (int *)0x0) goto LAB_007d37ea;
      iVar10 = pVVar11->pArray[lVar12];
      iVar9 = piVar5[iVar10];
      if (iVar9 != 0) {
        if (iVar9 < 1) {
          __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                        ,0x162,"int Spl_ManFindOne(Spl_Man_t *)");
        }
        if (iVar9 < 5) {
          iVar9 = Spl_ManLutFanouts(p->pGia,iVar10,p->vFanouts,p->vMarksNo,p->vMarksCIO);
          piVar5 = p->pGia->pLutRefs;
          if (piVar5 == (int *)0x0) goto LAB_007d37ea;
          if ((piVar5[iVar10] == 1) && (iVar9 == 1)) goto LAB_007d3717;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar11 = p->vNodes;
    } while (lVar12 < pVVar11->nSize);
  }
  p->vCands->nSize = 0;
  p->vInputs->nSize = 0;
  pVVar11 = p->vNodes;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      lVar14 = (long)pVVar11->pArray[lVar12];
      if ((lVar14 < 0) || (pVVar4 = p->pGia->vMapping2, pVVar4->nSize <= pVVar11->pArray[lVar12]))
      goto LAB_007d37cb;
      pVVar11 = pVVar4->pArray;
      if (pVVar11 == (Vec_Int_t *)0x0) break;
      if (0 < pVVar11[lVar14].nSize) {
        lVar15 = 0;
        do {
          uVar2 = pVVar11[lVar14].pArray[lVar15];
          if (((int)uVar2 < 0) || (p->vMarksNo->nSize <= (int)uVar2)) goto LAB_007d37ac;
          if (((uint)p->vMarksNo->pArray[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0) {
            if (p->vMarksCIO->nSize <= (int)uVar2) goto LAB_007d37ac;
            if (((uint)p->vMarksCIO->pArray[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0) {
              piVar5 = p->pGia->pLutRefs;
              if (piVar5 == (int *)0x0) goto LAB_007d37ea;
              if (piVar5[uVar2] == 0) {
                Vec_IntPush(p->vCands,uVar2);
                Vec_IntPush(p->vInputs,uVar2);
              }
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar11[lVar14].nSize);
      }
      lVar12 = lVar12 + 1;
      pVVar11 = p->vNodes;
    } while (lVar12 < pVVar11->nSize);
  }
  iVar10 = Spl_ManFindGoodCand(p);
  if (iVar10 != 0) goto LAB_007d372b;
  p->vCands->nSize = 0;
  p->vInputs->nSize = 0;
  pVVar11 = p->vNodes;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      lVar14 = (long)pVVar11->pArray[lVar12];
      if ((lVar14 < 0) || (pVVar4 = p->pGia->vMapping2, pVVar4->nSize <= pVVar11->pArray[lVar12]))
      goto LAB_007d37cb;
      pVVar11 = pVVar4->pArray;
      if (pVVar11 == (Vec_Int_t *)0x0) break;
      if (0 < pVVar11[lVar14].nSize) {
        lVar15 = 0;
        do {
          uVar2 = pVVar11[lVar14].pArray[lVar15];
          if (((int)uVar2 < 0) || (p->vMarksNo->nSize <= (int)uVar2)) goto LAB_007d37ac;
          if (((uint)p->vMarksNo->pArray[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0) {
            if (p->vMarksCIO->nSize <= (int)uVar2) {
LAB_007d37ac:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                            ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
            }
            if (((uint)p->vMarksCIO->pArray[uVar2 >> 5] >> (uVar2 & 0x1f) & 1) == 0) {
              Vec_IntPush(p->vCands,uVar2);
              Vec_IntPush(p->vInputs,uVar2);
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar11[lVar14].nSize);
      }
      lVar12 = lVar12 + 1;
      pVVar11 = p->vNodes;
    } while (lVar12 < pVVar11->nSize);
  }
  pVVar11 = p->vNodes;
  if (0 < pVVar11->nSize) {
    lVar12 = 0;
    do {
      piVar5 = p->pGia->pLutRefs;
      if (piVar5 == (int *)0x0) {
LAB_007d37ea:
        __assert_fail("p->pLutRefs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x25b,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
      }
      iVar10 = pVVar11->pArray[lVar12];
      iVar9 = piVar5[iVar10];
      if (iVar9 != 0) {
        if (iVar9 < 1) {
          __assert_fail("Gia_ObjLutRefNumId(p->pGia, iObj) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                        ,0x18d,"int Spl_ManFindOne(Spl_Man_t *)");
        }
        if (iVar9 < 5) {
          iVar9 = Spl_ManLutFanouts(p->pGia,iVar10,p->vFanouts,p->vMarksNo,p->vMarksCIO);
          piVar5 = p->pGia->pLutRefs;
          if (piVar5 == (int *)0x0) goto LAB_007d37ea;
          if ((piVar5[iVar10] == 1) && (iVar9 == 1)) goto LAB_007d3717;
          pVVar11 = p->vFanouts;
          if (0 < pVVar11->nSize) {
            pVVar6 = p->vCands;
            lVar14 = 0;
            do {
              Vec_IntPush(pVVar6,pVVar11->pArray[lVar14]);
              lVar14 = lVar14 + 1;
            } while (lVar14 < pVVar11->nSize);
          }
        }
      }
      lVar12 = lVar12 + 1;
      pVVar11 = p->vNodes;
    } while (lVar12 < pVVar11->nSize);
  }
  iVar10 = Spl_ManFindGoodCand(p);
  if (iVar10 != 0) goto LAB_007d372b;
  pVVar11 = p->vCands;
  if (pVVar11->nSize < 1) {
    iVar10 = 0;
    goto LAB_007d372b;
  }
LAB_007d3725:
  iVar10 = *pVVar11->pArray;
LAB_007d372b:
  pVVar11 = p->vNodes;
  if (0 < pVVar11->nSize) {
    pGVar3 = p->pGia;
    pVVar4 = pGVar3->vMapping2;
    piVar5 = pVVar11->pArray;
    lVar12 = 0;
    do {
      lVar14 = (long)piVar5[lVar12];
      if ((lVar14 < 0) || (pVVar4->nSize <= piVar5[lVar12])) {
LAB_007d37cb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar6 = pVVar4->pArray;
      if (pVVar6 == (Vec_Int_t *)0x0) {
        return iVar10;
      }
      if (0 < pVVar6[lVar14].nSize) {
        piVar7 = pGVar3->pLutRefs;
        if (piVar7 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x25c,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
        }
        piVar8 = pVVar6[lVar14].pArray;
        lVar15 = 0;
        do {
          piVar1 = piVar7 + piVar8[lVar15];
          *piVar1 = *piVar1 + 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < pVVar6[lVar14].nSize);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar11->nSize);
  }
  return iVar10;
LAB_007d3717:
  pVVar11 = p->vFanouts;
  if (pVVar11->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  goto LAB_007d3725;
}

Assistant:

int Spl_ManFindOne( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int nFanouts, iObj, iFan, i, k;
    int Res = 0; 

    // deref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );

    // collect external nodes
    if ( p->fReverse && (Vec_IntSize(p->vNodes) & 1) )
    {
        Vec_IntForEachEntry( p->vNodes, iObj, i )
        {
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
                continue;
            assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
                continue;
            nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
            if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
            {
                Res = Vec_IntEntry(p->vFanouts, 0);
                goto finish;
            }
            //Vec_IntAppend( p->vCands, p->vFanouts );
        }
    }

    // consider LUT inputs - get one that has no refs
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) && !Gia_ObjLutRefNumId(p->pGia, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // collect candidates
    Vec_IntClear( p->vCands );
    Vec_IntClear( p->vInputs );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) && !Vec_BitEntry(p->vMarksCIO, iFan) )
            {
                Vec_IntPush( p->vCands, iFan );
                Vec_IntPush( p->vInputs, iFan );
            }

    // all inputs have refs - collect external nodes
    Vec_IntForEachEntry( p->vNodes, iObj, i )
    {
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 0 )
            continue;
        assert( Gia_ObjLutRefNumId(p->pGia, iObj) > 0 );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) >= 5 )  // skip nodes with high fanout!
            continue;
        nFanouts = Spl_ManLutFanouts( p->pGia, iObj, p->vFanouts, p->vMarksNo, p->vMarksCIO );
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) == 1 && nFanouts == 1 )
        {
            Res = Vec_IntEntry(p->vFanouts, 0);
            goto finish;
        }
        Vec_IntAppend( p->vCands, p->vFanouts );
    }

    // choose among not-so-good ones
    Res = Spl_ManFindGoodCand( p );
    if ( Res )
        goto finish;

    // get the first candidate
    if ( Res == 0 && Vec_IntSize(p->vCands) > 0 )
        Res = Vec_IntEntry( p->vCands, 0 );

finish:
    // ref
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
    return Res;
}